

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O0

int InitGlobals(void)

{
  int local_c;
  int i;
  
  seanetfilenextlinecmd = -1;
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    bPauseBlueView[local_c] = 0;
    bRestartBlueView[local_c] = 0;
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    GNSSqualityNMEADevice[local_c] = 0;
    bPauseNMEADevice[local_c] = 0;
    bRestartNMEADevice[local_c] = 0;
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    GNSSqualityublox[local_c] = 0;
    bPauseublox[local_c] = 0;
    bRestartublox[local_c] = 0;
    std::
    vector<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(&RTCMuserslist,RTCMusers + local_c);
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    bEnableMAVLinkDeviceIN[local_c] = 0;
    bDisplayStatusTextMAVLinkDevice[local_c] = 0;
    custom_modeMAVLinkDevice[local_c] = -1;
    iArmMAVLinkDevice[local_c] = -1;
    setattitudetargetperiodMAVLinkDevice[local_c] = -1;
    setattitudetargettypeMAVLinkDevice[local_c] = -1;
    setattitudetargetrollMAVLinkDevice[local_c] = 0.0;
    setattitudetargetpitchMAVLinkDevice[local_c] = 0.0;
    setattitudetargetyawMAVLinkDevice[local_c] = 0.0;
    setattitudetargetroll_rateMAVLinkDevice[local_c] = 0.0;
    setattitudetargetpitch_rateMAVLinkDevice[local_c] = 0.0;
    setattitudetargetyaw_rateMAVLinkDevice[local_c] = 0.0;
    setattitudetargetthrustMAVLinkDevice[local_c] = 0.0;
    bTakeoffMAVLinkDevice[local_c] = 0;
    takeoff_altitudeMAVLinkDevice[local_c] = 0.0;
    bLandMAVLinkDevice[local_c] = 0;
    land_yawMAVLinkDevice[local_c] = 0.0;
    land_latitudeMAVLinkDevice[local_c] = 0.0;
    land_longitudeMAVLinkDevice[local_c] = 0.0;
    land_altitudeMAVLinkDevice[local_c] = 0.0;
    u1_servo_out_MAVLinkDevice[local_c] = 0.0;
    u2_servo_out_MAVLinkDevice[local_c] = 0.0;
    u3_servo_out_MAVLinkDevice[local_c] = 0.0;
    u4_servo_out_MAVLinkDevice[local_c] = 0.0;
    u5_servo_out_MAVLinkDevice[local_c] = 0.0;
    u6_servo_out_MAVLinkDevice[local_c] = 0.0;
    u7_servo_out_MAVLinkDevice[local_c] = 0.0;
    u8_servo_out_MAVLinkDevice[local_c] = 0.0;
    GNSSqualityMAVLinkDevice[local_c] = 0;
    bPauseMAVLinkDevice[local_c] = 0;
    bRestartMAVLinkDevice[local_c] = 0;
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    ShowGetPositionMaestroPololu[local_c] = -1;
    SetPositionMaestroPololu[local_c] = -1;
    bPausePololu[local_c] = 0;
    bRestartPololu[local_c] = 0;
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    bPauseRoboteq[local_c] = 0;
    bRestartRoboteq[local_c] = 0;
  }
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    InitCriticalSection(imgsCS + local_c);
    HorizontalBeamVideo[local_c] = 70.0;
    VerticalBeamVideo[local_c] = 50.0;
    xVideo[local_c] = 0.0;
    yVideo[local_c] = 0.0;
    zVideo[local_c] = 0.0;
    phiVideo[local_c] = 0.0;
    thetaVideo[local_c] = 0.0;
    psiVideo[local_c] = 0.0;
    bPauseVideo[local_c] = 0;
    bRestartVideo[local_c] = 0;
    InitCriticalSection(VideoRecordRequestsCS + local_c);
    VideoRecordRequests[local_c] = 0;
    bVideoRecordRestart[local_c] = 0;
    memset(videorecordfilenames + local_c,0,0x100);
    endvideorecordfiles[local_c] = (FILE *)0x0;
    memset(endvideorecordfilenames + local_c,0,0x100);
    videorecordwidth[local_c] = videoimgwidth;
    videorecordheight[local_c] = videoimgheight;
  }
  for (local_c = 0; local_c < nbopencvgui; local_c = local_c + 1) {
    InitCriticalSection(dispimgsCS + local_c);
  }
  InitCriticalSection(&SonarAltitudeEstimationCS);
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    bExternalProgramTrigger[local_c] = 0;
    InitCriticalSection(ExternalProgramTriggerCS + local_c);
    memset(ExternalProgramTriggerFileName + local_c,0,0x100);
    period_externalprogramtrigger[local_c] = 100;
    retrydelay_externalprogramtrigger[local_c] = 100;
    nbretries_externalprogramtrigger[local_c] = -1;
    procid_externalprogramtrigger[local_c] = -1;
    bExternalProgramTriggerDetected[local_c] = 0;
  }
  InitCriticalSection(&FollowMeCS);
  InitCriticalSection(&MDMCS);
  InitCriticalSection(&SeanetOverlayImgCS);
  InitCriticalSection(&SeanetConnectingCS);
  InitCriticalSection(&SeanetDataCS);
  InitCriticalSection(&StateVariablesCS);
  InitCriticalSection(&MissionFilesCS);
  InitCriticalSection(&OpenCVGUICS);
  InitCriticalSection(&OpenCVVideoCS);
  InitCriticalSection(&OpenCVVideoRecordCS);
  InitCriticalSection(&idsCS);
  InitCriticalSection(&RegistersCS);
  InitCriticalSection(&strtimeCS);
  opencvguikey = -1;
  opencvguikeytargetid = -1;
  StartChrono(&chrono_mission);
  StopChronoQuick(&chrono_mission);
  szAction[0xf0] = '\0';
  szAction[0xf1] = '\0';
  szAction[0xf2] = '\0';
  szAction[0xf3] = '\0';
  szAction[0xf4] = '\0';
  szAction[0xf5] = '\0';
  szAction[0xf6] = '\0';
  szAction[0xf7] = '\0';
  szAction[0xf8] = '\0';
  szAction[0xf9] = '\0';
  szAction[0xfa] = '\0';
  szAction[0xfb] = '\0';
  szAction[0xfc] = '\0';
  szAction[0xfd] = '\0';
  szAction[0xfe] = '\0';
  szAction[0xff] = '\0';
  szAction[0xe0] = '\0';
  szAction[0xe1] = '\0';
  szAction[0xe2] = '\0';
  szAction[0xe3] = '\0';
  szAction[0xe4] = '\0';
  szAction[0xe5] = '\0';
  szAction[0xe6] = '\0';
  szAction[0xe7] = '\0';
  szAction[0xe8] = '\0';
  szAction[0xe9] = '\0';
  szAction[0xea] = '\0';
  szAction[0xeb] = '\0';
  szAction[0xec] = '\0';
  szAction[0xed] = '\0';
  szAction[0xee] = '\0';
  szAction[0xef] = '\0';
  szAction[0xd0] = '\0';
  szAction[0xd1] = '\0';
  szAction[0xd2] = '\0';
  szAction[0xd3] = '\0';
  szAction[0xd4] = '\0';
  szAction[0xd5] = '\0';
  szAction[0xd6] = '\0';
  szAction[0xd7] = '\0';
  szAction[0xd8] = '\0';
  szAction[0xd9] = '\0';
  szAction[0xda] = '\0';
  szAction[0xdb] = '\0';
  szAction[0xdc] = '\0';
  szAction[0xdd] = '\0';
  szAction[0xde] = '\0';
  szAction[0xdf] = '\0';
  szAction[0xc0] = '\0';
  szAction[0xc1] = '\0';
  szAction[0xc2] = '\0';
  szAction[0xc3] = '\0';
  szAction[0xc4] = '\0';
  szAction[0xc5] = '\0';
  szAction[0xc6] = '\0';
  szAction[199] = '\0';
  szAction[200] = '\0';
  szAction[0xc9] = '\0';
  szAction[0xca] = '\0';
  szAction[0xcb] = '\0';
  szAction[0xcc] = '\0';
  szAction[0xcd] = '\0';
  szAction[0xce] = '\0';
  szAction[0xcf] = '\0';
  szAction[0xb0] = '\0';
  szAction[0xb1] = '\0';
  szAction[0xb2] = '\0';
  szAction[0xb3] = '\0';
  szAction[0xb4] = '\0';
  szAction[0xb5] = '\0';
  szAction[0xb6] = '\0';
  szAction[0xb7] = '\0';
  szAction[0xb8] = '\0';
  szAction[0xb9] = '\0';
  szAction[0xba] = '\0';
  szAction[0xbb] = '\0';
  szAction[0xbc] = '\0';
  szAction[0xbd] = '\0';
  szAction[0xbe] = '\0';
  szAction[0xbf] = '\0';
  szAction[0xa0] = '\0';
  szAction[0xa1] = '\0';
  szAction[0xa2] = '\0';
  szAction[0xa3] = '\0';
  szAction[0xa4] = '\0';
  szAction[0xa5] = '\0';
  szAction[0xa6] = '\0';
  szAction[0xa7] = '\0';
  szAction[0xa8] = '\0';
  szAction[0xa9] = '\0';
  szAction[0xaa] = '\0';
  szAction[0xab] = '\0';
  szAction[0xac] = '\0';
  szAction[0xad] = '\0';
  szAction[0xae] = '\0';
  szAction[0xaf] = '\0';
  szAction[0x90] = '\0';
  szAction[0x91] = '\0';
  szAction[0x92] = '\0';
  szAction[0x93] = '\0';
  szAction[0x94] = '\0';
  szAction[0x95] = '\0';
  szAction[0x96] = '\0';
  szAction[0x97] = '\0';
  szAction[0x98] = '\0';
  szAction[0x99] = '\0';
  szAction[0x9a] = '\0';
  szAction[0x9b] = '\0';
  szAction[0x9c] = '\0';
  szAction[0x9d] = '\0';
  szAction[0x9e] = '\0';
  szAction[0x9f] = '\0';
  szAction[0x80] = '\0';
  szAction[0x81] = '\0';
  szAction[0x82] = '\0';
  szAction[0x83] = '\0';
  szAction[0x84] = '\0';
  szAction[0x85] = '\0';
  szAction[0x86] = '\0';
  szAction[0x87] = '\0';
  szAction[0x88] = '\0';
  szAction[0x89] = '\0';
  szAction[0x8a] = '\0';
  szAction[0x8b] = '\0';
  szAction[0x8c] = '\0';
  szAction[0x8d] = '\0';
  szAction[0x8e] = '\0';
  szAction[0x8f] = '\0';
  szAction[0x70] = '\0';
  szAction[0x71] = '\0';
  szAction[0x72] = '\0';
  szAction[0x73] = '\0';
  szAction[0x74] = '\0';
  szAction[0x75] = '\0';
  szAction[0x76] = '\0';
  szAction[0x77] = '\0';
  szAction[0x78] = '\0';
  szAction[0x79] = '\0';
  szAction[0x7a] = '\0';
  szAction[0x7b] = '\0';
  szAction[0x7c] = '\0';
  szAction[0x7d] = '\0';
  szAction[0x7e] = '\0';
  szAction[0x7f] = '\0';
  szAction[0x60] = '\0';
  szAction[0x61] = '\0';
  szAction[0x62] = '\0';
  szAction[99] = '\0';
  szAction[100] = '\0';
  szAction[0x65] = '\0';
  szAction[0x66] = '\0';
  szAction[0x67] = '\0';
  szAction[0x68] = '\0';
  szAction[0x69] = '\0';
  szAction[0x6a] = '\0';
  szAction[0x6b] = '\0';
  szAction[0x6c] = '\0';
  szAction[0x6d] = '\0';
  szAction[0x6e] = '\0';
  szAction[0x6f] = '\0';
  szAction[0x50] = '\0';
  szAction[0x51] = '\0';
  szAction[0x52] = '\0';
  szAction[0x53] = '\0';
  szAction[0x54] = '\0';
  szAction[0x55] = '\0';
  szAction[0x56] = '\0';
  szAction[0x57] = '\0';
  szAction[0x58] = '\0';
  szAction[0x59] = '\0';
  szAction[0x5a] = '\0';
  szAction[0x5b] = '\0';
  szAction[0x5c] = '\0';
  szAction[0x5d] = '\0';
  szAction[0x5e] = '\0';
  szAction[0x5f] = '\0';
  szAction[0x40] = '\0';
  szAction[0x41] = '\0';
  szAction[0x42] = '\0';
  szAction[0x43] = '\0';
  szAction[0x44] = '\0';
  szAction[0x45] = '\0';
  szAction[0x46] = '\0';
  szAction[0x47] = '\0';
  szAction[0x48] = '\0';
  szAction[0x49] = '\0';
  szAction[0x4a] = '\0';
  szAction[0x4b] = '\0';
  szAction[0x4c] = '\0';
  szAction[0x4d] = '\0';
  szAction[0x4e] = '\0';
  szAction[0x4f] = '\0';
  szAction[0x30] = '\0';
  szAction[0x31] = '\0';
  szAction[0x32] = '\0';
  szAction[0x33] = '\0';
  szAction[0x34] = '\0';
  szAction[0x35] = '\0';
  szAction[0x36] = '\0';
  szAction[0x37] = '\0';
  szAction[0x38] = '\0';
  szAction[0x39] = '\0';
  szAction[0x3a] = '\0';
  szAction[0x3b] = '\0';
  szAction[0x3c] = '\0';
  szAction[0x3d] = '\0';
  szAction[0x3e] = '\0';
  szAction[0x3f] = '\0';
  szAction[0x20] = '\0';
  szAction[0x21] = '\0';
  szAction[0x22] = '\0';
  szAction[0x23] = '\0';
  szAction[0x24] = '\0';
  szAction[0x25] = '\0';
  szAction[0x26] = '\0';
  szAction[0x27] = '\0';
  szAction[0x28] = '\0';
  szAction[0x29] = '\0';
  szAction[0x2a] = '\0';
  szAction[0x2b] = '\0';
  szAction[0x2c] = '\0';
  szAction[0x2d] = '\0';
  szAction[0x2e] = '\0';
  szAction[0x2f] = '\0';
  szAction[0x10] = '\0';
  szAction[0x11] = '\0';
  szAction[0x12] = '\0';
  szAction[0x13] = '\0';
  szAction[0x14] = '\0';
  szAction[0x15] = '\0';
  szAction[0x16] = '\0';
  szAction[0x17] = '\0';
  szAction[0x18] = '\0';
  szAction[0x19] = '\0';
  szAction[0x1a] = '\0';
  szAction[0x1b] = '\0';
  szAction[0x1c] = '\0';
  szAction[0x1d] = '\0';
  szAction[0x1e] = '\0';
  szAction[0x1f] = '\0';
  szAction[0] = '\0';
  szAction[1] = '\0';
  szAction[2] = '\0';
  szAction[3] = '\0';
  szAction[4] = '\0';
  szAction[5] = '\0';
  szAction[6] = '\0';
  szAction[7] = '\0';
  szAction[8] = '\0';
  szAction[9] = '\0';
  szAction[10] = '\0';
  szAction[0xb] = '\0';
  szAction[0xc] = '\0';
  szAction[0xd] = '\0';
  szAction[0xe] = '\0';
  szAction[0xf] = '\0';
  memset(labels,0,0x1000);
  memset(procdefineaddrs,0,0x400);
  memset(procreturnaddrs,0,0x400);
  memset(procstackids,0,0x400);
  registers[0x1e] = 0.0;
  registers[0x1f] = 0.0;
  registers[0x1c] = 0.0;
  registers[0x1d] = 0.0;
  registers[0x1a] = 0.0;
  registers[0x1b] = 0.0;
  registers[0x18] = 0.0;
  registers[0x19] = 0.0;
  registers[0x16] = 0.0;
  registers[0x17] = 0.0;
  registers[0x14] = 0.0;
  registers[0x15] = 0.0;
  registers[0x12] = 0.0;
  registers[0x13] = 0.0;
  registers[0x10] = 0.0;
  registers[0x11] = 0.0;
  registers[0xe] = 0.0;
  registers[0xf] = 0.0;
  registers[0xc] = 0.0;
  registers[0xd] = 0.0;
  registers[10] = 0.0;
  registers[0xb] = 0.0;
  registers[8] = 0.0;
  registers[9] = 0.0;
  registers[6] = 0.0;
  registers[7] = 0.0;
  registers[4] = 0.0;
  registers[5] = 0.0;
  registers[2] = 0.0;
  registers[3] = 0.0;
  registers[0] = 0.0;
  registers[1] = 0.0;
  bDeleteRoute = 1;
  nbwpstmp = 0;
  memset(wpstmplat,0,0x2000);
  memset(wpstmplong,0,0x2000);
  memset(wpstmpalt,0,0x2000);
  bWaypointsChanged = 1;
  nbWPs = 0;
  CurWP = 0;
  memset(wpslat,0,0x2000);
  memset(wpslong,0,0x2000);
  memset(wpsalt,0,0x2000);
  rudderminangle = -0.7;
  ruddermidangle = 0.0;
  ruddermaxangle = 0.7;
  if (((robid == 0x1000000) || (robid == 0x2000000)) || (robid == 0x4000000)) {
    HeadingAndLateralControlMode = 2;
  }
  else {
    HeadingAndLateralControlMode = 0;
  }
  return 0;
}

Assistant:

inline int InitGlobals(void)
{
	int i = 0;

	// Missing error checking...

	seanetfilenextlinecmd = -1;

	for (i = 0; i < MAX_NB_BLUEVIEW; i++)
	{
		bPauseBlueView[i] = FALSE;
		bRestartBlueView[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_NMEADEVICE; i++)
	{
		GNSSqualityNMEADevice[i] = 0;
		bPauseNMEADevice[i] = FALSE;
		bRestartNMEADevice[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_UBLOX; i++)
	{
		GNSSqualityublox[i] = 0;
		bPauseublox[i] = FALSE;
		bRestartublox[i] = FALSE;
		RTCMuserslist.push_back(RTCMusers[i]);
	}

	for (i = 0; i < MAX_NB_MAVLINKDEVICE; i++)
	{
		bEnableMAVLinkDeviceIN[i] = FALSE;
		bDisplayStatusTextMAVLinkDevice[i] = FALSE;
		custom_modeMAVLinkDevice[i] = -1;
		iArmMAVLinkDevice[i] = -1;
		setattitudetargetperiodMAVLinkDevice[i] = -1;
		setattitudetargettypeMAVLinkDevice[i] = -1;
		setattitudetargetrollMAVLinkDevice[i] = 0;
		setattitudetargetpitchMAVLinkDevice[i] = 0;
		setattitudetargetyawMAVLinkDevice[i] = 0;
		setattitudetargetroll_rateMAVLinkDevice[i] = 0;
		setattitudetargetpitch_rateMAVLinkDevice[i] = 0;
		setattitudetargetyaw_rateMAVLinkDevice[i] = 0;
		setattitudetargetthrustMAVLinkDevice[i] = 0;
		bTakeoffMAVLinkDevice[i] = FALSE;
		takeoff_altitudeMAVLinkDevice[i] = 0;
		bLandMAVLinkDevice[i] = FALSE;
		land_yawMAVLinkDevice[i] = 0;
		land_latitudeMAVLinkDevice[i] = 0;
		land_longitudeMAVLinkDevice[i] = 0;
		land_altitudeMAVLinkDevice[i] = 0;
		u1_servo_out_MAVLinkDevice[i] = 0;
		u2_servo_out_MAVLinkDevice[i] = 0;
		u3_servo_out_MAVLinkDevice[i] = 0;
		u4_servo_out_MAVLinkDevice[i] = 0;
		u5_servo_out_MAVLinkDevice[i] = 0;
		u6_servo_out_MAVLinkDevice[i] = 0;
		u7_servo_out_MAVLinkDevice[i] = 0;
		u8_servo_out_MAVLinkDevice[i] = 0;
		GNSSqualityMAVLinkDevice[i] = 0;
		bPauseMAVLinkDevice[i] = FALSE;
		bRestartMAVLinkDevice[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_POLOLU; i++)
	{
		ShowGetPositionMaestroPololu[i] = -1;
		SetPositionMaestroPololu[i] = -1;
		bPausePololu[i] = FALSE;
		bRestartPololu[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_ROBOTEQ; i++)
	{
		bPauseRoboteq[i] = FALSE;
		bRestartRoboteq[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_VIDEO; i++)
	{
		InitCriticalSection(&imgsCS[i]);
#ifndef DISABLE_OPENCV_SUPPORT
		imgs[i] = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(imgs[i], CV_RGB(0, 0, 0), NULL);
#else
		imgmats[i] = cv::cvarrToMat(imgs[i]);
		imgmats[i] = cv::Mat::zeros(imgmats[i].size(), imgmats[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
		if (bUseRawImgPtrVideo) imgsbak[i] = imgs[i]; // To be able to release memory later if imgs is overwritten...
#endif // !DISABLE_OPENCV_SUPPORT
		HorizontalBeamVideo[i] = 70;
		VerticalBeamVideo[i] = 50;
		xVideo[i] = 0; yVideo[i] = 0; zVideo[i] = 0; phiVideo[i] = 0; thetaVideo[i] = 0; psiVideo[i] = 0;
		bPauseVideo[i] = FALSE;
		bRestartVideo[i] = FALSE;
		InitCriticalSection(&VideoRecordRequestsCS[i]);
		VideoRecordRequests[i] = 0;
		bVideoRecordRestart[i] = FALSE;
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		videorecordfiles[i] = NULL;
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
		memset(videorecordfilenames[i], 0, sizeof(videorecordfilenames[i]));
		endvideorecordfiles[i] = NULL;
		memset(endvideorecordfilenames[i], 0, sizeof(endvideorecordfilenames[i]));
		videorecordwidth[i] = videoimgwidth;
		videorecordheight[i] = videoimgheight;
	}

	for (i = 0; i < nbopencvgui; i++)
	{
		InitCriticalSection(&dispimgsCS[i]);
#ifndef DISABLE_OPENCV_SUPPORT
		dispimgs[i] = cvCreateImage(cvSize(opencvguiimgwidth[i], opencvguiimgheight[i]), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(dispimgs[i], CV_RGB(0, 0, 0), NULL);
#else
		dispimgmats[i] = cv::cvarrToMat(dispimgs[i]);
		dispimgmats[i] = cv::Mat::zeros(dispimgmats[i].size(), dispimgmats[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
	}

	InitCriticalSection(&SonarAltitudeEstimationCS);

#ifndef DISABLE_OPENCV_SUPPORT
	InitCriticalSection(&ExternalVisualLocalizationCS);
	InitCriticalSection(&ExternalVisualLocalizationOverlayImgCS);
	ExternalVisualLocalizationOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(ExternalVisualLocalizationOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	ExternalVisualLocalizationOverlayImgMat = cv::cvarrToMat(ExternalVisualLocalizationOverlayImg);
	ExternalVisualLocalizationOverlayImgMat = cv::Mat::zeros(ExternalVisualLocalizationOverlayImgMat.size(), ExternalVisualLocalizationOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&WallCS);
	InitCriticalSection(&WallOverlayImgCS);
	WallOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(WallOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	WallOverlayImgMat = cv::cvarrToMat(WallOverlayImg);
	WallOverlayImgMat = cv::Mat::zeros(WallOverlayImgMat.size(), WallOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	for (i = 0; i < MAX_NB_BALL; i++)
	{
		bBallTrackingControl[i] = FALSE;
		InitCriticalSection(&BallCS[i]);
		InitCriticalSection(&BallOverlayImgCS[i]);
		BallOverlayImg[i] = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(BallOverlayImg[i], CV_RGB(0, 0, 0), NULL);
#else
		BallOverlayImgMat[i] = cv::cvarrToMat(BallOverlayImg[i]);
		BallOverlayImgMat[i] = cv::Mat::zeros(BallOverlayImgMat[i].size(), BallOverlayImgMat[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
		hmin_ball[i] = 0; hmax_ball[i] = 0; smin_ball[i] = 0; smax_ball[i] = 0; vlmin_ball[i] = 0; vlmax_ball[i] = 0;
		bHExclusive_ball[i] = FALSE; bSExclusive_ball[i] = FALSE; bVLExclusive_ball[i] = FALSE;
		r_selpix_ball[i] = 0, g_selpix_ball[i] = 0, b_selpix_ball[i] = 0;
		colormodel_ball[i] = 0;
		objMinRadiusRatio_ball[i] = 0; objRealRadius_ball[i] = 0; objMinDetectionRatio_ball[i] = 0; objDetectionRatioDuration_ball[i] = 0; d0_ball[i] = 0;
		kh_ball[i] = 0; kv_ball[i] = 0;
		lightMin_ball[i] = 0;
		lightPixRatio_ball[i] = 0;
		bAcoustic_ball[i] = 0;
		bDepth_ball[i] = 0;
		camdir_ball[i] = 0;
		bDisableControl_ball[i] = FALSE;
		bBrake_ball[i] = FALSE;
		objtype_ball[i] = 0;
		mindistproc_ball[i] = 0;
		procid_ball[i] = 0;
		videoid_ball[i] = 0;
		u_ball[i] = 0;
		x_ball[i] = 0; y_ball[i] = 0; z_ball[i] = 0;
		psi_ball[i] = 0;
		lat_ball[i] = 0; long_ball[i] = 0; alt_ball[i] = 0;
		heading_ball[i] = 0;
		detectratio_ball[i] = 0;
		bBallFound[i] = FALSE;
		lightStatus_ball[i] = 0;
	}

	InitCriticalSection(&SurfaceVisualObstacleCS);
	InitCriticalSection(&SurfaceVisualObstacleOverlayImgCS);
	SurfaceVisualObstacleOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(SurfaceVisualObstacleOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	SurfaceVisualObstacleOverlayImgMat = cv::cvarrToMat(SurfaceVisualObstacleOverlayImg);
	SurfaceVisualObstacleOverlayImgMat = cv::Mat::zeros(SurfaceVisualObstacleOverlayImgMat.size(), SurfaceVisualObstacleOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&ObstacleCS);
	InitCriticalSection(&ObstacleOverlayImgCS);
	ObstacleOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(ObstacleOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	ObstacleOverlayImgMat = cv::cvarrToMat(ObstacleOverlayImg);
	ObstacleOverlayImgMat = cv::Mat::zeros(ObstacleOverlayImgMat.size(), ObstacleOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&PingerCS);
	InitCriticalSection(&PingerOverlayImgCS);
	PingerOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(PingerOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	PingerOverlayImgMat = cv::cvarrToMat(PingerOverlayImg);
	PingerOverlayImgMat = cv::Mat::zeros(PingerOverlayImgMat.size(), PingerOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT

	for (i = 0; i < MAX_NB_EXTERNALPROGRAMTRIGGER; i++)
	{
		bExternalProgramTrigger[i] = FALSE;
		InitCriticalSection(&ExternalProgramTriggerCS[i]);
		memset(ExternalProgramTriggerFileName[i], 0, MAX_BUF_LEN);
		period_externalprogramtrigger[i] = 100;
		retrydelay_externalprogramtrigger[i] = 100;
		nbretries_externalprogramtrigger[i] = -1;
		procid_externalprogramtrigger[i] = -1;
		bExternalProgramTriggerDetected[i] = FALSE;
	}

	InitCriticalSection(&FollowMeCS);

	InitCriticalSection(&MDMCS);

	InitCriticalSection(&SeanetOverlayImgCS);
	InitCriticalSection(&SeanetConnectingCS);
	InitCriticalSection(&SeanetDataCS);
#ifndef DISABLE_OPENCV_SUPPORT
	SeanetOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(SeanetOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	SeanetOverlayImgMat = cv::cvarrToMat(SeanetOverlayImg);
	SeanetOverlayImgMat = cv::Mat::zeros(SeanetOverlayImgMat.size(), SeanetOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
	colorsonarlidar = CV_RGB(255, 255, 0);
	fSeanetOverlayImg = SONAR_IMG_LEVER_ARMS|SONAR_IMG_ALL_DISTANCES|SONAR_IMG_NORMAL;
#endif // !DISABLE_OPENCV_SUPPORT

	InitCriticalSection(&StateVariablesCS);

	InitCriticalSection(&MissionFilesCS);

	InitCriticalSection(&OpenCVGUICS);
	InitCriticalSection(&OpenCVVideoCS);
	InitCriticalSection(&OpenCVVideoRecordCS);

	InitCriticalSection(&idsCS);

	InitCriticalSection(&RegistersCS);

	InitCriticalSection(&strtimeCS);

	opencvguikey = -1;
	opencvguikeytargetid = -1;

	StartChrono(&chrono_mission);
	StopChronoQuick(&chrono_mission);
	memset(szAction, 0, sizeof(szAction));
	memset(labels, 0, sizeof(labels));
	memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
	memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
	memset(procstackids, 0, sizeof(procstackids));

	memset(registers, 0, sizeof(registers));
	
	bDeleteRoute = TRUE;
	nbwpstmp = 0;
	memset(wpstmplat, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmplong, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmpalt, 0, MAX_NB_WP*sizeof(double));
	bWaypointsChanged = TRUE;
	nbWPs = 0;
	CurWP = 0;
	memset(wpslat, 0, MAX_NB_WP*sizeof(double));
	memset(wpslong, 0, MAX_NB_WP*sizeof(double));
	memset(wpsalt, 0, MAX_NB_WP*sizeof(double));

	rudderminangle = -0.7;
	ruddermidangle = 0.0;
	ruddermaxangle = 0.7;

	switch (robid)
	{
	case QUADRO_SIMULATOR_ROBID:
	case COPTER_ROBID:
	case ARDUCOPTER_ROBID:
		HeadingAndLateralControlMode = HEADING_AND_LATERAL_CONTROL_MODE;
		break;
	default:
		HeadingAndLateralControlMode = PURE_HEADING_CONTROL_MODE;
		break;
	}

	return EXIT_SUCCESS;
}